

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

int __thiscall Sudoku::rekurzivniReseni(Sudoku *this)

{
  int iVar1;
  undefined1 local_1cc [4];
  int vysledek;
  Sudoku novy;
  Sudoku *this_local;
  
  novy.s._436_8_ = this;
  Sudoku((Sudoku *)local_1cc,this);
  iVar1 = rKrok((Sudoku *)local_1cc,0);
  if (iVar1 == 1) {
    memcpy(this,local_1cc,0x1bc);
  }
  ~Sudoku((Sudoku *)local_1cc);
  return iVar1;
}

Assistant:

int Sudoku::rekurzivniReseni()
{
  Sudoku novy(this); // okopirujeme si sudoku
  int vysledek = novy.rKrok(0); // zkusime na nem rekurzivni metodu
  if(vysledek == true)
  {
    s = novy.s;// v pripade uspechu z nej prebereme jeho stav
  }
  return vysledek;// vratime vysledek pokusu, at je jakykoliv
}